

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuaternion.h
# Opt level: O2

cbtQuaternion __thiscall cbtQuaternion::inverse(cbtQuaternion *this)

{
  undefined1 auVar1 [16];
  cbtQuaternion cVar2;
  
  cVar2.super_cbtQuadWord.m_floats._0_8_ =
       *(ulong *)(this->super_cbtQuadWord).m_floats ^ 0x8000000080000000;
  auVar1._0_4_ = -(this->super_cbtQuadWord).m_floats[2];
  auVar1._4_4_ = 0x80000000;
  auVar1._8_4_ = 0x80000000;
  auVar1._12_4_ = 0x80000000;
  auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)(this->super_cbtQuadWord).m_floats[3]),0x1c);
  cVar2.super_cbtQuadWord.m_floats._8_8_ = auVar1._0_8_;
  return (cbtQuaternion)cVar2.super_cbtQuadWord.m_floats;
}

Assistant:

cbtQuaternion inverse() const
	{
#if defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE)
		return cbtQuaternion(_mm_xor_ps(mVec128, vQInv));
#elif defined(BT_USE_NEON)
		return cbtQuaternion((cbtSimdFloat4)veorq_s32((int32x4_t)mVec128, (int32x4_t)vQInv));
#else
		return cbtQuaternion(-m_floats[0], -m_floats[1], -m_floats[2], m_floats[3]);
#endif
	}